

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::NetworkHttpClient::openWebSocket
          (NetworkHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  HttpClient *pHVar1;
  int __flags;
  void *__child_stack;
  __fn *in_R8;
  void *__arg;
  Options in_R9W;
  size_t sVar2;
  StringPtr url_00;
  StringPtr value;
  String path;
  HttpHeaders headersCopy;
  Url parsed;
  
  __flags = 1;
  __arg = (void *)0x100;
  url_00.content.size_ = 1;
  url_00.content.ptr = (char *)headers;
  Url::parse(&parsed,(Url *)url.content.size_,url_00,0x100,in_R9W);
  Url::toString(&path,&parsed,HTTP_REQUEST);
  HttpHeaders::clone(&headersCopy,in_R8,__child_stack,__flags,__arg);
  if (parsed.host.content.size_ == 0) {
    parsed.host.content.ptr = "";
  }
  sVar2 = parsed.host.content.size_ + (parsed.host.content.size_ == 0);
  value.content.size_ = sVar2;
  value.content.ptr = parsed.host.content.ptr;
  requireValidHeaderValue(value);
  headersCopy.indexedHeaders.ptr[0xb].content.ptr = parsed.host.content.ptr;
  headersCopy.indexedHeaders.ptr[0xb].content.size_ = sVar2;
  pHVar1 = getClient((NetworkHttpClient *)url.content.ptr,&parsed);
  if (path.content.size_ == 0) {
    path.content.ptr = "";
  }
  (*pHVar1->_vptr_HttpClient[1])
            (this,pHVar1,path.content.ptr,path.content.size_ + (path.content.size_ == 0),
             &headersCopy);
  HttpHeaders::~HttpHeaders(&headersCopy);
  Array<char>::~Array(&path.content);
  Url::~Url(&parsed);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    // We need to parse the proxy-style URL to convert it to origin-form.
    // https://www.rfc-editor.org/rfc/rfc9112.html#name-origin-form
    // Use URL parsing options that avoid unnecessary rewrites.
    Url::Options urlOptions;
    urlOptions.allowEmpty = true;
    urlOptions.percentDecode = false;

    auto parsed = Url::parse(url, Url::HTTP_PROXY_REQUEST, urlOptions);
    auto path = parsed.toString(Url::HTTP_REQUEST);
    auto headersCopy = headers.clone();
    headersCopy.set(HttpHeaderId::HOST, parsed.host);
    return getClient(parsed).openWebSocket(path, headersCopy);
  }